

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_layout.cc
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
upb::generator::SortedUniqueEnumNumbers
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,EnumDefPtr e)

{
  int iVar1;
  int iVar2;
  iterator __first;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_80;
  const_iterator local_78;
  const_iterator local_70;
  uint *local_68;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_60;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_58;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> last;
  EnumValDefPtr local_40;
  value_type_conflict4 local_34;
  int local_30;
  int i;
  undefined1 local_19;
  EnumDefPtr local_18;
  EnumDefPtr e_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *values;
  
  local_19 = 0;
  local_18.ptr_ = e.ptr_;
  e_local.ptr_ = (upb_EnumDef *)__return_storage_ptr__;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  iVar1 = EnumDefPtr::value_count(&local_18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (__return_storage_ptr__,(long)iVar1);
  for (local_30 = 0; iVar1 = local_30, iVar2 = EnumDefPtr::value_count(&local_18), iVar1 < iVar2;
      local_30 = local_30 + 1) {
    local_40 = EnumDefPtr::value(&local_18,local_30);
    local_34 = EnumValDefPtr::number(&local_40);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (__return_storage_ptr__,&local_34);
  }
  __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(__return_storage_ptr__);
  last._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(__return_storage_ptr__)
  ;
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__first._M_current,last);
  local_60._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         (__return_storage_ptr__);
  local_68 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               (__return_storage_ptr__);
  local_58 = std::
             unique<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                       (local_60,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                  )local_68);
  __gnu_cxx::
  __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
  __normal_iterator<unsigned_int*>
            ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
              *)&local_70,&local_58);
  local_80._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(__return_storage_ptr__)
  ;
  __gnu_cxx::
  __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
  __normal_iterator<unsigned_int*>
            ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
              *)&local_78,&local_80);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
            (__return_storage_ptr__,local_70,local_78);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> SortedUniqueEnumNumbers(upb::EnumDefPtr e) {
  std::vector<uint32_t> values;
  values.reserve(e.value_count());
  for (int i = 0; i < e.value_count(); i++) {
    values.push_back(static_cast<uint32_t>(e.value(i).number()));
  }
  std::sort(values.begin(), values.end());
  auto last = std::unique(values.begin(), values.end());
  values.erase(last, values.end());
  return values;
}